

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

char * idToVersion(PolicyID id)

{
  if (id < (CMPCOUNT|CMP0001)) {
    return (&PTR_anon_var_dwarf_2e7af7_005bee48)[id];
  }
  return (char *)0x0;
}

Assistant:

static const char* idToVersion(cmPolicies::PolicyID id)
{
  switch(id)
    {
#define POLICY_CASE(ID, V_MAJOR, V_MINOR, V_PATCH) \
    case cmPolicies::ID: \
      return #V_MAJOR "." #V_MINOR "." #V_PATCH;
  CM_FOR_EACH_POLICY_ID_VERSION(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return 0;
    }
  return 0;
}